

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

ImGuiID ImGui::GetColumnsID(char *str_id,int columns_count)

{
  ImGuiWindow *this;
  int int_id;
  ImGuiID IVar1;
  char *str;
  
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  int_id = columns_count + 0x11223347;
  if (str_id != (char *)0x0) {
    int_id = 0x11223347;
  }
  str = "columns";
  if (str_id != (char *)0x0) {
    str = str_id;
  }
  PushID(int_id);
  IVar1 = ImGuiWindow::GetID(this,str,(char *)0x0);
  PopID();
  return IVar1;
}

Assistant:

ImGuiID ImGui::GetColumnsID(const char* str_id, int columns_count)
{
    ImGuiWindow* window = GetCurrentWindow();

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (str_id ? 0 : columns_count));
    ImGuiID id = window->GetID(str_id ? str_id : "columns");
    PopID();

    return id;
}